

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaPValAttrNodeID(xmlSchemaParserCtxtPtr ctxt,xmlAttrPtr attr)

{
  int iVar1;
  int iVar2;
  xmlChar *value;
  xmlSchemaTypePtr node;
  xmlChar *pxVar3;
  xmlChar *unaff_RBX;
  char *value_00;
  xmlChar *unaff_R12;
  
  value = xmlNodeGetContent((xmlNode *)attr);
  iVar1 = xmlValidateNCName(value,1);
  if (iVar1 == 0) {
    iVar1 = 0;
    if (attr->atype == XML_ATTRIBUTE_ID) goto LAB_0019513b;
    pxVar3 = xmlSchemaCollapseString(value);
    if (pxVar3 != (xmlChar *)0x0) {
      (*xmlFree)(value);
      value = pxVar3;
    }
    iVar2 = xmlAddIDSafe(attr,value);
    if (iVar2 < 0) {
      xmlSchemaPErrMemory(ctxt);
      goto LAB_0019513b;
    }
    if (iVar2 != 0) goto LAB_0019513b;
    node = xmlSchemaGetBuiltInType(XML_SCHEMAS_ID);
    value_00 = "Duplicate value \'%s\' of simple type \'xs:ID\'";
  }
  else {
    if (iVar1 < 1) goto LAB_0019513b;
    node = xmlSchemaGetBuiltInType(XML_SCHEMAS_ID);
    value_00 = "The value \'%s\' of simple type \'xs:ID\' is not a valid \'xs:NCName\'";
  }
  iVar1 = 0xbdd;
  xmlSchemaPSimpleTypeErr
            (ctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)attr,(xmlNodePtr)node,
             (xmlSchemaTypePtr)0x0,(char *)0x0,(xmlChar *)value_00,(char *)value,unaff_RBX,unaff_R12
            );
LAB_0019513b:
  if (value != (xmlChar *)0x0) {
    (*xmlFree)(value);
  }
  return iVar1;
}

Assistant:

static int
xmlSchemaPValAttrNodeID(xmlSchemaParserCtxtPtr ctxt, xmlAttrPtr attr)
{
    int ret;
    const xmlChar *value;

    if (attr == NULL)
	return(0);
    value = xmlSchemaGetNodeContentNoDict((xmlNodePtr) attr);
    ret = xmlValidateNCName(value, 1);
    if (ret == 0) {
	/*
	* NOTE: the IDness might have already be declared in the DTD
	*/
	if (attr->atype != XML_ATTRIBUTE_ID) {
	    xmlChar *strip;
            int res;

	    /*
	    * TODO: Use xmlSchemaStrip here; it's not exported at this
	    * moment.
	    */
	    strip = xmlSchemaCollapseString(value);
	    if (strip != NULL) {
		xmlFree((xmlChar *) value);
		value = strip;
	    }
	    res = xmlAddIDSafe(attr, value);
            if (res < 0) {
                xmlSchemaPErrMemory(ctxt);
	    } else if (res == 0) {
		ret = XML_SCHEMAP_S4S_ATTR_INVALID_VALUE;
		xmlSchemaPSimpleTypeErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
		    NULL, (xmlNodePtr) attr,
		    xmlSchemaGetBuiltInType(XML_SCHEMAS_ID),
		    NULL, NULL, "Duplicate value '%s' of simple "
		    "type 'xs:ID'", value, NULL);
	    }
	}
    } else if (ret > 0) {
	ret = XML_SCHEMAP_S4S_ATTR_INVALID_VALUE;
	xmlSchemaPSimpleTypeErr(ctxt,
	    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
	    NULL, (xmlNodePtr) attr,
	    xmlSchemaGetBuiltInType(XML_SCHEMAS_ID),
	    NULL, NULL, "The value '%s' of simple type 'xs:ID' is "
	    "not a valid 'xs:NCName'",
	    value, NULL);
    }
    if (value != NULL)
	xmlFree((xmlChar *)value);

    return (ret);
}